

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O0

void __thiscall despot::RegDemo::Init(RegDemo *this,istream *is)

{
  undefined8 this_00;
  int iVar1;
  int iVar2;
  istream *piVar3;
  RegDemoState *pRVar4;
  reference ppRVar5;
  reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  reference pvVar9;
  reference pvVar10;
  size_type sVar11;
  State local_d8 [32];
  State local_b8 [36];
  int local_94;
  State local_90 [4];
  int next;
  State local_70 [32];
  int local_50;
  int local_4c;
  int a;
  int s;
  int x;
  string local_38 [8];
  string tok;
  istream *is_local;
  RegDemo *this_local;
  
  tok.field_2._8_8_ = is;
  std::__cxx11::string::string(local_38);
  piVar3 = std::operator>>((istream *)tok.field_2._8_8_,local_38);
  piVar3 = std::operator>>(piVar3,local_38);
  std::istream::operator>>(piVar3,&this->size_);
  std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::resize
            (&this->states_,(long)(this->size_ + 1));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->obs_,(long)(this->size_ + 1));
  std::vector<double,_std::allocator<double>_>::resize(&this->trap_prob_,(long)(this->size_ + 1));
  for (a = 0; a < this->size_; a = a + 1) {
    pRVar4 = (RegDemoState *)operator_new(0x20);
    RegDemoState::RegDemoState(pRVar4,a);
    ppRVar5 = std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::
              operator[](&this->states_,(long)a);
    *ppRVar5 = pRVar4;
    sVar11 = (size_type)a;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->obs_,sVar11);
    this_00 = tok.field_2._8_8_;
    *pvVar6 = (ulong)(sVar11 == 2);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&this->trap_prob_,(long)a);
    std::istream::operator>>((void *)this_00,pvVar7);
    if (a == this->size_ + -1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&this->trap_prob_,(long)a);
      this->goal_reward_ = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&this->trap_prob_,(long)a);
      *pvVar7 = 0.0;
    }
  }
  pRVar4 = (RegDemoState *)operator_new(0x20);
  RegDemoState::RegDemoState(pRVar4,this->size_);
  ppRVar5 = std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::operator[]
                      (&this->states_,(long)this->size_);
  *ppRVar5 = pRVar4;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->obs_,(long)this->size_);
  *pvVar6 = 2;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->trap_prob_,(long)this->size_);
  *pvVar7 = 1.0;
  sVar11 = std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::size
                     (&this->states_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(&this->transition_probabilities_,sVar11);
  for (local_4c = 0; uVar8 = (ulong)local_4c,
      sVar11 = std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::size
                         (&this->states_), uVar8 < sVar11; local_4c = local_4c + 1) {
    pvVar9 = std::
             vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
             ::operator[](&this->transition_probabilities_,(long)local_4c);
    iVar1 = (**(code **)(*(long *)this + 0x28))();
    std::
    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
    ::resize(pvVar9,(long)iVar1);
    for (local_50 = 0; iVar1 = local_50, iVar2 = (**(code **)(*(long *)this + 0x28))(),
        iVar1 < iVar2; local_50 = local_50 + 1) {
      if (local_4c == this->size_) {
        pvVar9 = std::
                 vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                 ::operator[](&this->transition_probabilities_,(long)local_4c);
        pvVar10 = std::
                  vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                  ::operator[](pvVar9,(long)local_50);
        despot::State::State(local_70,local_4c,1.0);
        std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar10,local_70);
        despot::State::~State(local_70);
      }
      else if (local_50 == 0) {
        if (local_4c != this->size_ + -1) {
          pvVar9 = std::
                   vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                   ::operator[](&this->transition_probabilities_,(long)local_4c);
          pvVar10 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar9,(long)local_50);
          despot::State::State(local_90,local_4c,1.0);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar10,local_90);
          despot::State::~State(local_90);
        }
      }
      else {
        local_94 = local_4c;
        if (local_50 == 2) {
          local_94 = local_4c + 1;
        }
        if (local_50 == 1) {
          local_94 = local_4c + -1;
        }
        if (local_94 < 0) {
          local_94 = 0;
        }
        if (this->size_ <= local_94) {
          local_94 = this->size_ + -1;
        }
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->trap_prob_,(long)local_94);
        if (*pvVar7 <= 1.0 && *pvVar7 != 1.0) {
          pvVar9 = std::
                   vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                   ::operator[](&this->transition_probabilities_,(long)local_4c);
          pvVar10 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar9,(long)local_50);
          iVar1 = local_94;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->trap_prob_,(long)local_94);
          despot::State::State(local_b8,iVar1,1.0 - *pvVar7);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar10,local_b8);
          despot::State::~State(local_b8);
        }
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->trap_prob_,(long)local_94);
        if (0.0 < *pvVar7) {
          pvVar9 = std::
                   vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                   ::operator[](&this->transition_probabilities_,(long)local_4c);
          pvVar10 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar9,(long)local_50);
          iVar1 = this->size_;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->trap_prob_,(long)local_94);
          despot::State::State(local_d8,iVar1,*pvVar7);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar10,local_d8);
          despot::State::~State(local_d8);
        }
      }
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void RegDemo::Init(istream& is) {
	string tok;
	is >> tok >> tok >> size_;
	states_.resize(size_ + 1);
	obs_.resize(size_ + 1);
	trap_prob_.resize(size_ + 1);
	for (int x = 0; x < size_; x++) {
		states_[x] = new RegDemoState(x);
		obs_[x] = (x == 2 ? 1 : 0);

		is >> trap_prob_[x];

		if (x == size_ - 1) {
			goal_reward_ = trap_prob_[x];
			trap_prob_[x] = 0;
		}
	}
	states_[size_] = new RegDemoState(size_); // Trapped
	obs_[size_] = 2;
	trap_prob_[size_] = 1.0; // No way to escape

	// Build transition matrix
	transition_probabilities_.resize(states_.size());
	for (int s = 0; s < states_.size(); s++) {
		transition_probabilities_[s].resize(NumActions());

		for (int a = 0; a < NumActions(); a++) {
			if (s == size_) {
				transition_probabilities_[s][a].push_back(State(s, 1.0));
			} else if (a == A_STAY) {
				if (s != size_ - 1) // Not a terminal state
					transition_probabilities_[s][a].push_back(State(s, 1.0));
			} else {
				int next = s;
				if (a == A_RIGHT)
					next = s + 1;
				if (a == A_LEFT)
					next = s - 1;

				if (next < 0)
					next = 0;
				if (next >= size_)
					next = size_ - 1;

				if (trap_prob_[next] < 1.0)
					transition_probabilities_[s][a].push_back(
						State(next, 1 - trap_prob_[next]));
				if (trap_prob_[next] > 0.0)
					transition_probabilities_[s][a].push_back(
						State(size_, trap_prob_[next]));
			}
		}
	}
}